

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

word Extra_Truth6MinimumHeuristic(word t)

{
  int iVar1;
  word a;
  word b;
  int nOnes;
  word tMin2;
  word tMin1;
  word t_local;
  
  iVar1 = Extra_Truth6Ones(t);
  if (iVar1 < 0x20) {
    t_local = Extra_Truth6MinimumRoundMany(t);
  }
  else if (iVar1 < 0x21) {
    a = Extra_Truth6MinimumRoundMany(t);
    b = Extra_Truth6MinimumRoundMany(t ^ 0xffffffffffffffff);
    t_local = Abc_MinWord(a,b);
  }
  else {
    t_local = Extra_Truth6MinimumRoundMany(t ^ 0xffffffffffffffff);
  }
  return t_local;
}

Assistant:

word Extra_Truth6MinimumHeuristic( word t )
{
    word tMin1, tMin2;
    int nOnes = Extra_Truth6Ones( t );
    if ( nOnes < 32 )
        return Extra_Truth6MinimumRoundMany( t );
    if ( nOnes > 32 )
        return Extra_Truth6MinimumRoundMany( ~t );
    tMin1 = Extra_Truth6MinimumRoundMany(  t );
    tMin2 = Extra_Truth6MinimumRoundMany( ~t );
    return Abc_MinWord( tMin1, tMin2 );
}